

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t rar5_read_header(archive_read *a,archive_entry *entry)

{
  int *piVar1;
  wchar_t wVar2;
  int *piVar3;
  void *pvVar4;
  long lVar5;
  long request;
  ulong min;
  bool bVar6;
  long local_40;
  char signature [8];
  
  piVar1 = (int *)a->format->data;
  if (piVar1[0x14cd] == -1) {
    piVar1[0x14cd] = 0;
  }
  if (*piVar1 == 0) {
    (a->archive).archive_format = 0x100000;
    (a->archive).archive_format_name = "RAR5";
    piVar3 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
    if ((piVar3 != (int *)0x0) &&
       ((((char)*piVar3 == 'M' && (*(char *)((long)piVar3 + 1) == 'Z')) || (*piVar3 == 0x464c457f)))
       ) {
      rar5_signature(signature);
      min = 0x1000;
      lVar5 = 0;
      do {
        while( true ) {
          if (0x80000 < min + lVar5) goto LAB_0012988a;
          pvVar4 = __archive_read_ahead(a,min,&local_40);
          if (pvVar4 != (void *)0x0) break;
          bVar6 = min < 0x80;
          min = min >> 1;
          if (bVar6) goto LAB_0012996c;
        }
        if (local_40 < 0x40) {
LAB_0012996c:
          archive_set_error(&a->archive,0x54,"Couldn\'t find out RAR header");
          return L'\xffffffe2';
        }
        for (request = 0; (ulong)((long)pvVar4 + request + 8) < (ulong)(local_40 + (long)pvVar4);
            request = request + 0x10) {
          if (*(char (*) [8])((long)pvVar4 + request) == signature) {
            __archive_read_consume(a,request);
            goto LAB_0012988a;
          }
        }
        __archive_read_consume(a,request);
        lVar5 = lVar5 + request;
      } while( true );
    }
LAB_0012988a:
    *piVar1 = 1;
  }
  if (piVar1[1] == 0) {
    wVar2 = consume(a,8);
    if (wVar2 != L'\0') {
      return L'\x01';
    }
    piVar1[1] = 1;
  }
  do {
    do {
      wVar2 = process_base_block(a,entry);
    } while (wVar2 == L'\xfffffff6');
  } while ((wVar2 == L'\0') && ((*(byte *)(piVar1 + 0xb) & 4) != 0));
  return wVar2;
}

Assistant:

static int rar5_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct rar5* rar = get_context(a);
	int ret;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not.
	 */
	if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		rar->has_encrypted_entries = 0;
	}

	if(rar->header_initialized == 0) {
		init_header(a);
		if ((ret = try_skip_sfx(a)) < ARCHIVE_WARN)
			return ret;
		rar->header_initialized = 1;
	}

	if(rar->skipped_magic == 0) {
		if(ARCHIVE_OK != consume(a, sizeof(rar5_signature_xor))) {
			return ARCHIVE_EOF;
		}

		rar->skipped_magic = 1;
	}

	do {
		ret = process_base_block(a, entry);
	} while(ret == ARCHIVE_RETRY ||
			(rar->main.endarc > 0 && ret == ARCHIVE_OK));

	return ret;
}